

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O1

void * icu_63::ZNames::createTimeZoneAndPutInCache
                 (UHashtable *cache,UChar **names,UnicodeString *tzID,UErrorCode *status)

{
  bool bVar1;
  UChar *pUVar2;
  UChar *pUVar3;
  UChar *pUVar4;
  UChar *pUVar5;
  UChar *pUVar6;
  undefined4 uVar7;
  UnicodeString *__src;
  void *__dest;
  UChar *key;
  undefined8 *value;
  size_t s;
  UnicodeString *name;
  UnicodeString locationNameUniStr;
  UnicodeString local_70;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if (*names == (UChar *)0x0) {
      name = &local_70;
      local_70.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003c0258
      ;
      local_70.fUnion.fStackFields.fLengthAndFlags = 2;
      TimeZoneNamesImpl::getDefaultExemplarLocationName(tzID,name);
      uVar7 = local_70.fUnion.fFields.fLength;
      if (-1 < local_70.fUnion.fStackFields.fLengthAndFlags) {
        uVar7 = (int)local_70.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      if ((int)uVar7 < 1) {
        bVar1 = true;
        __dest = (void *)0x0;
      }
      else {
        __src = (UnicodeString *)UnicodeString::getTerminatedBuffer(&local_70);
        if (-1 < local_70.fUnion.fStackFields.fLengthAndFlags) {
          local_70.fUnion.fFields.fLength = (int)local_70.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
        s = (size_t)(local_70.fUnion.fFields.fLength * 2 + 2);
        __dest = uprv_malloc_63(s);
        bVar1 = __dest != (void *)0x0;
        if (__dest == (void *)0x0) {
          *status = U_MEMORY_ALLOCATION_ERROR;
        }
        else {
          memcpy(__dest,__src,s);
          name = __src;
        }
      }
      UnicodeString::~UnicodeString(&local_70);
      if (!bVar1) {
        return (void *)0x0;
      }
    }
    else {
      __dest = (void *)0x0;
      name = (UnicodeString *)names;
    }
    key = ZoneMeta::findTimeZoneID(tzID);
    value = (undefined8 *)UMemory::operator_new((UMemory *)0x40,(size_t)name);
    if (value == (undefined8 *)0x0) {
      value = (undefined8 *)0x0;
    }
    else {
      *(undefined1 *)(value + 7) = 0;
      pUVar2 = names[1];
      pUVar3 = names[2];
      pUVar4 = names[3];
      pUVar5 = names[4];
      pUVar6 = names[5];
      *value = *names;
      value[1] = pUVar2;
      value[2] = pUVar3;
      value[3] = pUVar4;
      value[4] = pUVar5;
      value[5] = pUVar6;
      value[6] = names[6];
      if (__dest == (void *)0x0) {
        *(undefined1 *)((long)value + 0x39) = 0;
      }
      else {
        *(undefined1 *)((long)value + 0x39) = 1;
        *value = __dest;
      }
    }
    if (value != (undefined8 *)0x0) {
      uhash_put_63(cache,key,value,status);
      return value;
    }
    *status = U_MEMORY_ALLOCATION_ERROR;
  }
  return (void *)0x0;
}

Assistant:

const UChar* getName(UTimeZoneNameType type) const {
        UTimeZoneNameTypeIndex index = getTZNameTypeIndex(type);
        return index >= 0 ? fNames[index] : NULL;
    }